

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_MeshNgon * __thiscall
ON_MeshComponentRef::MeshNgon(ON_MeshComponentRef *this,ON_MeshNgonBuffer *ngon_buffer)

{
  uint mesh_face_index;
  TYPE TVar1;
  ON_Mesh *this_00;
  ON_MeshNgon *pOVar2;
  
  this_00 = this->m_mesh;
  if (this_00 != (ON_Mesh *)0x0) {
    mesh_face_index = (this->m_mesh_ci).m_index;
    if (-1 < (long)(int)mesh_face_index) {
      TVar1 = (this->m_mesh_ci).m_type;
      if (TVar1 == mesh_face) {
        if ((int)mesh_face_index < (this_00->m_F).m_count) {
          pOVar2 = ON_MeshNgon::NgonFromMeshFace
                             (ngon_buffer,mesh_face_index,
                              (uint *)((this_00->m_F).m_a + (int)mesh_face_index));
          return pOVar2;
        }
      }
      else if (TVar1 == mesh_ngon) {
        pOVar2 = ON_Mesh::Ngon(this_00,mesh_face_index);
        return pOVar2;
      }
    }
  }
  return (ON_MeshNgon *)0x0;
}

Assistant:

const class ON_MeshNgon* ON_MeshComponentRef::MeshNgon(
    class ON_MeshNgonBuffer& ngon_buffer
    ) const
{
  const class ON_MeshNgon* ngon = 0;
  if ( 0 != m_mesh && m_mesh_ci.m_index >= 0 )
  {
    if ( ON_COMPONENT_INDEX::mesh_ngon == m_mesh_ci.m_type )
    {
      ngon = m_mesh->Ngon(m_mesh_ci.m_index);
    }
    else if ( ON_COMPONENT_INDEX::mesh_face == m_mesh_ci.m_type && m_mesh_ci.m_index < m_mesh->m_F.Count() )
    {
      ngon = ON_MeshNgon::NgonFromMeshFace(ngon_buffer,(unsigned int)m_mesh_ci.m_index,(const unsigned int*)m_mesh->m_F[m_mesh_ci.m_index].vi);
    }
  }
  return ngon;
}